

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WjTestLib.c
# Opt level: O0

void WjTestLib_NewGroup(char *GroupName)

{
  WjtlGroupList *pWVar1;
  WjtlGroupList *pWVar2;
  char *pcVar3;
  WjtlGroupList *newGroup;
  char *GroupName_local;
  
  pWVar2 = (WjtlGroupList *)calloc(1,0x28);
  if (pWVar2 == (WjtlGroupList *)0x0) {
    InternalError("Memory Fail");
    pWVar2 = gGroupListTail;
    pWVar1 = gGroupListHead;
  }
  else {
    pcVar3 = strdup(GroupName);
    pWVar2->GroupName = pcVar3;
    if (pWVar2->GroupName == (char *)0x0) {
      InternalError("Memory Fail");
      pWVar2 = gGroupListTail;
      pWVar1 = gGroupListHead;
    }
    else {
      pWVar2->Next = (WjtlGroupList *)0x0;
      pWVar2->TestListHead = (WjtlTestList *)0x0;
      pWVar2->TestListTail = (WjtlTestList *)0x0;
      pWVar1 = pWVar2;
      if (gGroupListTail != (WjtlGroupList *)0x0) {
        gGroupListTail->Next = pWVar2;
        pWVar1 = gGroupListHead;
      }
    }
  }
  gGroupListHead = pWVar1;
  gGroupListTail = pWVar2;
  return;
}

Assistant:

void
WjTestLib_NewGroup
    (
        char const*     GroupName
    )
{
    WjtlGroupList* newGroup = calloc( 1, sizeof(WjtlGroupList) );
    if( NULL != newGroup )
    {
        newGroup->GroupName = strdup( GroupName );
        if( NULL != newGroup->GroupName )
        {
            newGroup->Next = NULL;
            newGroup->TestListHead = NULL;
            newGroup->TestListTail = NULL;

            if( NULL != gGroupListTail )
            {
                gGroupListTail->Next = newGroup;
            }
            else
            {
                gGroupListHead = newGroup;
            }
            gGroupListTail = newGroup;
        }
        else
        {
            InternalError( "Memory Fail" );
        }
    }
    else
    {
        InternalError( "Memory Fail" );
    }
}